

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall FIX::HttpServer::onStart(HttpServer *this)

{
  bool bVar1;
  int __fd;
  HttpServer *in_RSI;
  SocketServer *pSVar2;
  
  do {
    __fd = (int)in_RSI;
    pSVar2 = this->m_pServer;
    if (this->m_stop != false) goto LAB_001931ee;
    if (pSVar2 == (SocketServer *)0x0) {
      return;
    }
    in_RSI = this;
    bVar1 = SocketServer::block(pSVar2,&this->super_Strategy,false,0.0);
    __fd = (int)in_RSI;
  } while (bVar1);
  pSVar2 = this->m_pServer;
LAB_001931ee:
  if (pSVar2 != (SocketServer *)0x0) {
    SocketServer::close(pSVar2,__fd);
    pSVar2 = this->m_pServer;
    if (pSVar2 != (SocketServer *)0x0) {
      SocketServer::~SocketServer(pSVar2);
    }
    operator_delete(pSVar2,0x160);
    this->m_pServer = (SocketServer *)0x0;
  }
  return;
}

Assistant:

void HttpServer::onStart() {
  while (!m_stop && m_pServer && m_pServer->block(*this)) {}

  if (!m_pServer) {
    return;
  }

  m_pServer->close();
  delete m_pServer;
  m_pServer = 0;
}